

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadUnitsFromComponent
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  bool bVar1;
  XmlNodePtr childNode;
  UnitsPtr units;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  XmlNode::firstChild((XmlNode *)&local_50);
  while (local_50._M_ptr != (XmlNode *)0x0) {
    bVar1 = XmlNode::isCellml1XElement(local_50._M_ptr,"units");
    if (bVar1) {
      Units::create();
      loadUnits(this,(UnitsPtr *)&local_40,(XmlNodePtr *)&local_50);
      Model::addUnits((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,(UnitsPtr *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    XmlNode::next((XmlNode *)&local_40);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_50,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void Parser::ParserImpl::loadUnitsFromComponent(const ModelPtr &model, const XmlNodePtr &node)
{
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isCellml1XElement("units")) {
            UnitsPtr units = Units::create();
            loadUnits(units, childNode);
            model->addUnits(units);
        }
        childNode = childNode->next();
    }
}